

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::DictionaryTypeHandlerBase<int>::DeleteProperty_Internal<true>
          (DictionaryTypeHandlerBase<int> *this,DynamicObject *instance,PropertyId propertyId,
          PropertyOperationFlags propertyOperationFlags)

{
  code *pcVar1;
  DictionaryPropertyDescriptor<int> *scriptContext_00;
  PropertyOperationFlags flags;
  Type TVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  BOOL BVar6;
  uint32 index;
  undefined4 *puVar7;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  PrototypeChainCache<Js::NoSpecialPropertyCache> *this_01;
  char16 *pcVar8;
  PropertyRecord *this_02;
  JavascriptLibrary *this_03;
  RecyclableObject *value;
  Type *this_04;
  int dataSlot;
  Var undefined;
  Type local_40;
  PropertyRecord *propertyRecord;
  DictionaryPropertyDescriptor<int> *descriptor;
  ScriptContext *scriptContext;
  PropertyOperationFlags propertyOperationFlags_local;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  DictionaryTypeHandlerBase<int> *this_local;
  
  scriptContext._0_4_ = propertyOperationFlags;
  scriptContext._4_4_ = propertyId;
  _propertyOperationFlags_local = (RuntimeFunction *)instance;
  instance_local = (DynamicObject *)this;
  descriptor = (DictionaryPropertyDescriptor<int> *)
               RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
  if (scriptContext._4_4_ == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x406,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  local_40.ptr = (GlobalObject *)
                 ScriptContext::GetPropertyName((ScriptContext *)descriptor,scriptContext._4_4_);
  this_00 = Memory::
            WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
            ::operator->(&this->propertyMap);
  bVar3 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)this_00,(PropertyRecord **)&local_40,
                     (DictionaryPropertyDescriptor<int> **)&propertyRecord);
  if (bVar3) {
    bVar3 = DynamicTypeHandler::GetHasSpecialProperties(&this->super_DynamicTypeHandler);
    if ((!bVar3) &&
       (bVar3 = NoSpecialPropertyCache::IsDefaultHandledSpecialProperty(scriptContext._4_4_), bVar3)
       ) {
      DynamicTypeHandler::SetHasSpecialProperties(&this->super_DynamicTypeHandler);
      bVar4 = DynamicTypeHandler::GetFlags(&this->super_DynamicTypeHandler);
      if ((bVar4 & 0x20) != 0) {
        ScriptContext::GetLibrary((ScriptContext *)descriptor);
        JavascriptLibrary::GetTypesWithNoSpecialPropertyProtoChainCache
                  ((JavascriptLibrary *)&undefined);
        this_01 = Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::
                  operator->((WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>
                              *)&undefined);
        PrototypeChainCache<Js::NoSpecialPropertyCache>::Clear(this_01);
      }
    }
    bVar3 = DictionaryPropertyDescriptor<int>::SanityCheckFixedBits
                      ((DictionaryPropertyDescriptor<int> *)propertyRecord);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x413,"(descriptor->SanityCheckFixedBits())",
                                  "descriptor->SanityCheckFixedBits()");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    flags = (PropertyOperationFlags)scriptContext;
    scriptContext_00 = descriptor;
    if (((ulong)(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject & 0x800) == 0) {
      if ((((ulong)(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                   _vptr_IRecyclerVisitedObject & 0x200) == 0) ||
         (((ulong)(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject & 0x1000) != 0)) {
        this_02 = ScriptContext::GetPropertyName((ScriptContext *)descriptor,scriptContext._4_4_);
        pcVar8 = PropertyRecord::GetBuffer(this_02);
        JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable
                  (flags,(ScriptContext *)scriptContext_00,pcVar8);
        this_local._4_4_ = 0;
      }
      else {
        this_03 = ScriptContext::GetLibrary((ScriptContext *)descriptor);
        value = JavascriptLibraryBase::GetUndefined(&this_03->super_JavascriptLibraryBase);
        bVar3 = DictionaryPropertyDescriptor<int>::HasNonLetConstGlobal
                          ((DictionaryPropertyDescriptor<int> *)propertyRecord);
        if (bVar3) {
          iVar5 = DictionaryPropertyDescriptor<int>::GetDataPropertyIndex<false>
                            ((DictionaryPropertyDescriptor<int> *)propertyRecord);
          if (iVar5 == -1) {
            bVar3 = DictionaryPropertyDescriptor<int>::GetIsAccessor
                              ((DictionaryPropertyDescriptor<int> *)propertyRecord);
            if (!bVar3) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 1;
              bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                          ,0x439,"(descriptor->GetIsAccessor())",
                                          "descriptor->GetIsAccessor()");
              if (!bVar3) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 0;
            }
            TVar2.ptr = _propertyOperationFlags_local;
            iVar5 = DictionaryPropertyDescriptor<int>::GetGetterPropertyIndex
                              ((DictionaryPropertyDescriptor<int> *)propertyRecord);
            DynamicTypeHandler::SetSlotUnchecked((DynamicObject *)TVar2.ptr,iVar5,value);
            TVar2.ptr = _propertyOperationFlags_local;
            iVar5 = DictionaryPropertyDescriptor<int>::GetSetterPropertyIndex
                              ((DictionaryPropertyDescriptor<int> *)propertyRecord);
            DynamicTypeHandler::SetSlotUnchecked((DynamicObject *)TVar2.ptr,iVar5,value);
          }
          else {
            DynamicTypeHandler::SetSlotUnchecked
                      ((DynamicObject *)_propertyOperationFlags_local,iVar5,value);
          }
          bVar4 = DynamicTypeHandler::GetFlags(&this->super_DynamicTypeHandler);
          if ((bVar4 & 0x20) != 0) {
            ScriptContext::InvalidateProtoCaches((ScriptContext *)descriptor,scriptContext._4_4_);
          }
          if (((ulong)(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject & 0x1000) == 0) {
            bVar3 = DictionaryPropertyDescriptor<int>::GetIsShadowed
                              ((DictionaryPropertyDescriptor<int> *)propertyRecord);
            if (bVar3) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 1;
              bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                          ,0x445,"(!descriptor->GetIsShadowed())",
                                          "!descriptor->GetIsShadowed()");
              if (!bVar3) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 0;
            }
            *(undefined1 *)
             ((long)&(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                     _vptr_IRecyclerVisitedObject + 1) = 0xe;
          }
          else {
            *(byte *)((long)&(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                             _vptr_IRecyclerVisitedObject + 1) =
                 *(byte *)((long)&(propertyRecord->super_FinalizableObject).
                                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + 1) &
                 0xf8;
            *(byte *)((long)&(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                             _vptr_IRecyclerVisitedObject + 1) =
                 *(byte *)((long)&(propertyRecord->super_FinalizableObject).
                                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + 1) |
                 0xe;
          }
          InvalidateFixedField<int>
                    (this,(DynamicObject *)_propertyOperationFlags_local,scriptContext._4_4_,
                     (DictionaryPropertyDescriptor<int> *)propertyRecord);
          this_04 = RecyclableObject::GetType((RecyclableObject *)_propertyOperationFlags_local);
          BVar6 = Js::Type::HasBeenCached(this_04);
          if (BVar6 != 0) {
            DynamicObject::ChangeType((DynamicObject *)_propertyOperationFlags_local);
          }
          DynamicTypeHandler::SetPropertyUpdateSideEffect
                    (&this->super_DynamicTypeHandler,(DynamicObject *)_propertyOperationFlags_local,
                     scriptContext._4_4_,(Var)0x0,SideEffects_Any);
          this_local._4_4_ = 1;
        }
        else {
          if (((ulong)(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject & 0x1000) == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                        ,0x45a,"(descriptor->Attributes & 0x10)",
                                        "descriptor->Attributes & PropertyLetConstGlobal");
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
          this_local._4_4_ = 0;
        }
      }
    }
    else if (((ulong)(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                     _vptr_IRecyclerVisitedObject & 0x1000) == 0) {
      this_local._4_4_ = 1;
    }
    else {
      pcVar8 = PropertyRecord::GetBuffer((PropertyRecord *)local_40.ptr);
      JavascriptError::ThrowCantDeleteIfStrictMode(flags,(ScriptContext *)scriptContext_00,pcVar8);
      this_local._4_4_ = 0;
    }
  }
  else {
    bVar3 = DynamicObject::HasObjectArray((DynamicObject *)_propertyOperationFlags_local);
    if ((bVar3) &&
       (bVar3 = PropertyRecord::IsNumeric((PropertyRecord *)local_40.ptr),
       TVar2.ptr = _propertyOperationFlags_local, bVar3)) {
      index = PropertyRecord::GetNumericValue((PropertyRecord *)local_40.ptr);
      this_local._4_4_ =
           DynamicTypeHandler::DeleteItem
                     (&this->super_DynamicTypeHandler,(DynamicObject *)TVar2.ptr,index,
                      (PropertyOperationFlags)scriptContext);
    }
    else {
      this_local._4_4_ = 1;
    }
  }
  return this_local._4_4_;
}

Assistant:

BOOL DictionaryTypeHandlerBase<T>::DeleteProperty_Internal(DynamicObject* instance, PropertyId propertyId, PropertyOperationFlags propertyOperationFlags)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
        DictionaryPropertyDescriptor<T>* descriptor;
        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = scriptContext->GetPropertyName(propertyId);
        if (propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
            if (!this->GetHasSpecialProperties() && NoSpecialPropertyCache::IsDefaultHandledSpecialProperty(propertyId))
            {
                this->SetHasSpecialProperties();
                if (GetFlags() & IsPrototypeFlag)
                {
                    scriptContext->GetLibrary()->GetTypesWithNoSpecialPropertyProtoChainCache()->Clear();
                }
            }
#if ENABLE_FIXED_FIELDS
            Assert(descriptor->SanityCheckFixedBits());
#endif
            if (descriptor->Attributes & PropertyDeleted)
            {
                // If PropertyDeleted and PropertyLetConstGlobal are set then we have both
                // a deleted global property and let/const variable in this descriptor.
                // If allowLetConstGlobal is true then the let/const shadows the property
                // and we should return false for a failed delete by going into the else
                // if branch below.
                if (allowLetConstGlobal && (descriptor->Attributes & PropertyLetConstGlobal))
                {
                    JavascriptError::ThrowCantDeleteIfStrictMode(propertyOperationFlags, scriptContext, propertyRecord->GetBuffer());

                    return false;
                }
                return true;
            }
            else if (!(descriptor->Attributes & PropertyConfigurable) ||
                (allowLetConstGlobal && (descriptor->Attributes & PropertyLetConstGlobal)))
            {
                // Let/const properties do not have attributes and they cannot be deleted
                JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable(
                    propertyOperationFlags, scriptContext, scriptContext->GetPropertyName(propertyId)->GetBuffer());

                return false;
            }

            Var undefined = scriptContext->GetLibrary()->GetUndefined();

            if (descriptor->HasNonLetConstGlobal())
            {
                T dataSlot = descriptor->template GetDataPropertyIndex<false>();
                if (dataSlot != NoSlots)
                {
                    SetSlotUnchecked(instance, dataSlot, undefined);
                }
                else
                {
                    Assert(descriptor->GetIsAccessor());
                    SetSlotUnchecked(instance, descriptor->GetGetterPropertyIndex(), undefined);
                    SetSlotUnchecked(instance, descriptor->GetSetterPropertyIndex(), undefined);
                }

                if (this->GetFlags() & IsPrototypeFlag)
                {
                    scriptContext->InvalidateProtoCaches(propertyId);
                }

                if ((descriptor->Attributes & PropertyLetConstGlobal) == 0)
                {
                    Assert(!descriptor->GetIsShadowed());
                    descriptor->Attributes = PropertyDeletedDefaults;
                }
                else
                {
                    descriptor->Attributes &= ~PropertyDynamicTypeDefaults;
                    descriptor->Attributes |= PropertyDeletedDefaults;
                }
#if ENABLE_FIXED_FIELDS
                InvalidateFixedField(instance, propertyId, descriptor);
#endif

                // Change the type so as we can invalidate the cache in fast path jit
                if (instance->GetType()->HasBeenCached())
                {
                    instance->ChangeType();
                }
                SetPropertyUpdateSideEffect(instance, propertyId, nullptr, SideEffects_Any);
                return true;
            }

            Assert(descriptor->Attributes & PropertyLetConstGlobal);
            return false;
        }

        // Check numeric propertyRecord only if objectArray available
        if (instance->HasObjectArray() && propertyRecord->IsNumeric())
        {
            return DictionaryTypeHandlerBase<T>::DeleteItem(instance, propertyRecord->GetNumericValue(), propertyOperationFlags);
        }

        return true;
    }